

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

LoopContinueLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_loopcontinue(NeuralNetworkLayer *this)

{
  LoopContinueLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0x271) {
    clear_layer(this);
    this->_oneof_case_[0] = 0x271;
    this_00 = (LoopContinueLayerParams *)operator_new(0x18);
    LoopContinueLayerParams::LoopContinueLayerParams(this_00);
    (this->layer_).loopcontinue_ = this_00;
  }
  return (LoopContinueLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LoopContinueLayerParams* NeuralNetworkLayer::mutable_loopcontinue() {
  if (!has_loopcontinue()) {
    clear_layer();
    set_has_loopcontinue();
    layer_.loopcontinue_ = new ::CoreML::Specification::LoopContinueLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.loopContinue)
  return layer_.loopcontinue_;
}